

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O2

void __thiscall
QOpenGLTextureCache::QOpenGLTextureCache(QOpenGLTextureCache *this,QOpenGLContext *ctx)

{
  int iVar1;
  QOpenGLContextGroup *pQVar2;
  qsizetype maxCost;
  long in_FS_OFFSET;
  bool ok;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QOpenGLContextGroup *)QOpenGLContext::shareGroup();
  QOpenGLSharedResource::QOpenGLSharedResource(&this->super_QOpenGLSharedResource,pQVar2);
  *(undefined ***)this = &PTR__QOpenGLTextureCache_001a12d8;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  local_19 = false;
  iVar1 = qEnvironmentVariableIntValue("QT_OPENGL_TEXTURE_CACHE_SIZE",&local_19);
  maxCost = 0x100000;
  if (local_19 != false) {
    maxCost = (long)iVar1;
  }
  QCache<unsigned_long_long,_QOpenGLCachedTexture>::QCache(&this->m_cache,maxCost);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLTextureCache::QOpenGLTextureCache(QOpenGLContext *ctx)
    : QOpenGLSharedResource(ctx->shareGroup())
    , m_cache(cacheSize())
{
}